

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O3

Error __thiscall
miniros::MasterLink::execute
          (MasterLink *this,string *method,RpcValue *request,RpcValue *response,RpcValue *payload,
          bool wait_for_master)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Internal *pIVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  Error_t EVar9;
  uint __seconds;
  char *method_00;
  WallDuration *rhs;
  string *psVar10;
  ulong uVar11;
  void *pvVar12;
  undefined7 in_register_00000089;
  string local_c8;
  RPCManager *local_a8;
  string *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  XmlRpcClient *local_90;
  undefined4 local_84;
  ulong local_80;
  RpcValue *local_78;
  string master_host;
  TimeBase<miniros::SteadyTime,_miniros::WallDuration> local_40;
  SteadyTime start_time;
  
  local_84 = (undefined4)CONCAT71(in_register_00000089,wait_for_master);
  if (this->internal_ == (Internal *)0x0) {
    EVar9 = InternalError;
  }
  else {
    local_a0 = method;
    local_78 = response;
    start_time = SteadyTime::now();
    master_host._M_dataplus._M_p = (pointer)&master_host.field_2;
    pcVar2 = (this->internal_->host)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&master_host,pcVar2,pcVar2 + (this->internal_->host)._M_string_length);
    pIVar3 = this->internal_;
    if (pIVar3 == (Internal *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)pIVar3->port;
    }
    local_a8 = (pIVar3->rpcManager).
               super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_98 = (pIVar3->rpcManager).
               super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_98->_M_use_count = local_98->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_98->_M_use_count = local_98->_M_use_count + 1;
      }
    }
    if (local_a8 == (element_type *)0x0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (execute::loc.initialized_ == false) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"miniros.master_link","");
        console::initializeLogLocation(&execute::loc,&local_c8,Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      if (execute::loc.level_ != Error) {
        console::setLogLocationLevel(&execute::loc,Error);
        console::checkLogLocationEnabled(&execute::loc);
      }
      EVar9 = InternalError;
      if (execute::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,execute::loc.logger_,execute::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                       ,0xcb,
                       "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                       ,"[%s] - no manager",(local_a0->_M_dataplus)._M_p);
      }
    }
    else {
      paVar1 = &local_c8.field_2;
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"/","");
      local_90 = RPCManager::getXMLRPCClient(local_a8,&master_host,(int)uVar11,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_90 == (XmlRpcClient *)0x0) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
            ::loc.initialized_ == false) {
          local_c8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,"miniros.master_link","");
          console::initializeLogLocation
                    (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                      ::loc,&local_c8,Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != paVar1) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
        if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
            ::loc.level_ != Error) {
          console::setLogLocationLevel
                    (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                      ::loc,Error);
          console::checkLogLocationEnabled
                    (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                      ::loc);
        }
        EVar9 = InvalidURI;
        if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
            ::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,
                         execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                         ::loc.logger_,
                         execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                         ::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                         ,0xd0,
                         "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                         ,"[%s] - failed make connection to host=\"%s:%d\"",
                         (local_a0->_M_dataplus)._M_p,master_host._M_dataplus._M_p,uVar11);
        }
      }
      else {
        bVar5 = (byte)local_84;
        bVar4 = 0;
        bVar8 = false;
        local_80 = uVar11;
        do {
          method_00 = (local_a0->_M_dataplus)._M_p;
          bVar6 = XmlRpc::XmlRpcClient::execute(local_90,method_00,request,local_78);
          __seconds = (uint)method_00;
          bVar7 = isShuttingDown();
          if (bVar7) {
            bVar7 = false;
LAB_001dd83c:
            bVar8 = RPCManager::validateXmlrpcResponse(local_a8,local_a0,local_78,payload);
            if (!bVar8) {
              EVar9 = InvalidResponse;
              RPCManager::releaseXMLRPCClient(local_a8,local_90);
              goto LAB_001dd99b;
            }
            if ((bool)(bVar4 & bVar7)) {
              if (console::g_initialized == '\0') {
                console::initialize();
              }
              if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                  ::loc.initialized_ == false) {
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_c8,"miniros.master_link","");
                console::initializeLogLocation
                          (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                            ::loc,&local_c8,Info);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
              }
              if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                  ::loc.level_ != Info) {
                console::setLogLocationLevel
                          (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                            ::loc,Info);
                console::checkLogLocationEnabled
                          (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                            ::loc);
              }
              bVar7 = true;
              if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                  ::loc.logger_enabled_ == true) {
                console::print((FilterBase *)0x0,
                               execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                               ::loc.logger_,
                               execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                               ::loc.level_,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                               ,0x102,
                               "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                               ,"Connected to master at [%s:%d]",master_host._M_dataplus._M_p,
                               local_80);
              }
            }
            goto LAB_001dd8a3;
          }
          bVar7 = RPCManager::isShuttingDown(local_a8);
          if (bVar6 || bVar7) {
            bVar7 = !bVar7;
            goto LAB_001dd83c;
          }
          if (!bVar8 && ((bVar5 ^ 1) & 1) == 0) {
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                ::loc.initialized_ == false) {
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c8,"miniros.master_link","");
              psVar10 = &local_c8;
              console::initializeLogLocation
                        (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                          ::loc,&local_c8,Error);
              __seconds = (uint)psVar10;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                uVar11 = local_c8.field_2._M_allocated_capacity + 1;
                operator_delete(local_c8._M_dataplus._M_p,uVar11);
                __seconds = (uint)uVar11;
              }
            }
            if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                ::loc.level_ != Error) {
              __seconds = 3;
              console::setLogLocationLevel
                        (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                          ::loc,Error);
              console::checkLogLocationEnabled
                        (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                          ::loc);
            }
            bVar8 = true;
            if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                ::loc.logger_enabled_ == true) {
              pvVar12 = execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                        ::loc.logger_;
              console::print((FilterBase *)0x0,
                             execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                             ::loc.logger_,
                             execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                             ::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                             ,0xe5,
                             "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                             ,"[%s] Failed to contact master at [%s:%d].  %s",
                             (local_a0->_M_dataplus)._M_p,master_host._M_dataplus._M_p,local_80,
                             "Retrying...");
              __seconds = (uint)pvVar12;
            }
          }
          if ((char)local_84 == '\0') {
LAB_001dd987:
            EVar9 = NoMaster;
            RPCManager::releaseXMLRPCClient(local_a8,local_90);
            goto LAB_001dd99b;
          }
          bVar6 = DurationBase<miniros::WallDuration>::isZero
                            (&(this->internal_->retry_timeout).
                              super_DurationBase<miniros::WallDuration>);
          if (!bVar6) {
            local_40 = (TimeBase<miniros::SteadyTime,_miniros::WallDuration>)SteadyTime::now();
            TimeBase<miniros::SteadyTime,_miniros::WallDuration>::operator-
                      ((TimeBase<miniros::SteadyTime,_miniros::WallDuration> *)&local_c8,
                       (SteadyTime *)&local_40);
            rhs = &this->internal_->retry_timeout;
            bVar6 = DurationBase<miniros::WallDuration>::operator>=
                              ((DurationBase<miniros::WallDuration> *)&local_c8,rhs);
            __seconds = (uint)rhs;
            if (bVar6) {
              if (console::g_initialized == '\0') {
                console::initialize();
              }
              if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                  ::loc.initialized_ == false) {
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_c8,"miniros.master_link","");
                console::initializeLogLocation
                          (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                            ::loc,&local_c8,Error);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
              }
              if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                  ::loc.level_ != Error) {
                console::setLogLocationLevel
                          (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                            ::loc,Error);
                console::checkLogLocationEnabled
                          (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                            ::loc);
              }
              if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                  ::loc.logger_enabled_ == true) {
                console::print((FilterBase *)0x0,
                               execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                               ::loc.logger_,
                               execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                               ::loc.level_,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                               ,0xef,
                               "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                               ,"[%s] Timed out trying to connect to the master after [%f] seconds",
                               (double)(this->internal_->retry_timeout).
                                       super_DurationBase<miniros::WallDuration>.nsec * 1e-09 +
                               (double)(this->internal_->retry_timeout).
                                       super_DurationBase<miniros::WallDuration>.sec,
                               (local_a0->_M_dataplus)._M_p);
              }
              goto LAB_001dd987;
            }
          }
          local_c8._M_dataplus._M_p = (pointer)0x0;
          DurationBase<miniros::WallDuration>::fromSec
                    ((DurationBase<miniros::WallDuration> *)&local_c8,0.05);
          WallDuration::sleep((WallDuration *)&local_c8,__seconds);
          bVar6 = isShuttingDown();
          if (bVar6) break;
          bVar6 = RPCManager::isShuttingDown(local_a8);
          bVar4 = 1;
        } while (!bVar6);
        bVar7 = false;
LAB_001dd8a3:
        RPCManager::releaseXMLRPCClient(local_a8,local_90);
        EVar9 = Ok;
        if (!bVar7) {
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
              ::loc.initialized_ == false) {
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"miniros.master_link","");
            console::initializeLogLocation
                      (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                        ::loc,&local_c8,Error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
          }
          if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
              ::loc.level_ != Error) {
            console::setLogLocationLevel
                      (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                        ::loc,Error);
            console::checkLogLocationEnabled
                      (&execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                        ::loc);
          }
          EVar9 = ShutdownInterrupt;
          if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
              ::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,
                           execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                           ::loc.logger_,
                           execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                           ::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                           ,0x108,
                           "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                           ,"[%s] Got shutdown request during RPC call",(local_a0->_M_dataplus)._M_p
                          );
          }
        }
      }
    }
LAB_001dd99b:
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)master_host._M_dataplus._M_p != &master_host.field_2) {
      operator_delete(master_host._M_dataplus._M_p,master_host.field_2._M_allocated_capacity + 1);
    }
  }
  return (Error)EVar9;
}

Assistant:

Error MasterLink::execute(const std::string& method, const RpcValue& request, RpcValue& response,
  RpcValue& payload, bool wait_for_master) const
{
  if (!internal_)
    return Error::InternalError;
  miniros::SteadyTime start_time = miniros::SteadyTime::now();

  std::string master_host = getHost();
  uint32_t master_port = getPort();
  RPCManagerPtr manager = internal_->rpcManager;
  if (!manager) {
    MINIROS_ERROR("[%s] - no manager", method.c_str());
    return Error::InternalError;
  }
  XmlRpc::XmlRpcClient* c = manager->getXMLRPCClient(master_host, master_port, "/");
  if (!c) {
    MINIROS_ERROR("[%s] - failed make connection to host=\"%s:%d\"", method.c_str(), master_host.c_str(), master_port);
    return Error::InvalidURI;
  }
  bool printed = false;
  bool slept = false;
  bool ok = true;
  bool b = false;
  do {
    {
#if defined(__APPLE__)
      std::scoped_lock<std::mutex> lock(internal_->xmlrpc_call_mutex);
#endif

      b = c->execute(method.c_str(), request, response);
    }

    ok = !miniros::isShuttingDown() && !manager->isShuttingDown();

    if (!b && ok) {
      if (!printed && wait_for_master) {
        MINIROS_ERROR("[%s] Failed to contact master at [%s:%d].  %s", method.c_str(), master_host.c_str(), master_port,
          wait_for_master ? "Retrying..." : "");
        printed = true;
      }

      if (!wait_for_master) {
        manager->releaseXMLRPCClient(c);
        return Error::NoMaster;
      }

      if (!internal_->retry_timeout.isZero() && (miniros::SteadyTime::now() - start_time) >= internal_->retry_timeout) {
        MINIROS_ERROR("[%s] Timed out trying to connect to the master after [%f] seconds", method.c_str(), internal_->retry_timeout.toSec());
        manager->releaseXMLRPCClient(c);
        return Error::NoMaster;
      }

      (void)miniros::WallDuration(0.05).sleep();
      slept = true;
    } else {
      if (!manager->validateXmlrpcResponse(method, response, payload)) {
        manager->releaseXMLRPCClient(c);
        return Error::InvalidResponse;
      }
      break;
    }

    ok = !miniros::isShuttingDown() && !manager->isShuttingDown();
  } while (ok);

  if (ok && slept) {
    MINIROS_INFO("Connected to master at [%s:%d]", master_host.c_str(), master_port);
  }

  manager->releaseXMLRPCClient(c);

  if (!ok) {
    MINIROS_ERROR("[%s] Got shutdown request during RPC call", method.c_str());
    return Error::ShutdownInterrupt;
  }
  return Error::Ok;;
}